

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables.c
# Opt level: O0

ip_tables_t * parse_tables(char *path)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  ip_chain_t *piVar4;
  ip_rule_t *piVar5;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  ip_table_t *local_440;
  ip_table_t *ipt;
  ip_tables_t *ipts;
  int in_table;
  int line_num;
  char line [1024];
  FILE *fp;
  char *path_local;
  
  __stream = fopen(path,"r");
  memset(&in_table,0,0x400);
  bVar1 = false;
  local_440 = (ip_table_t *)0x0;
  if (__stream == (FILE *)0x0) {
    _log(__x);
    path_local = (char *)0x0;
  }
  else {
    path_local = (char *)new(0x20);
    while (pcVar3 = fgets((char *)&in_table,0x400,__stream), pcVar3 != (char *)0x0) {
      if (((char)in_table != '#') && ((char)in_table != '\n')) {
        iVar2 = strcmp((char *)&in_table,"COMMIT\n");
        if ((iVar2 == 0) && (bVar1)) {
          bVar1 = false;
        }
        else if (((char)in_table != '*') || (bVar1)) {
          if (((char)in_table == ':') && (bVar1)) {
            piVar4 = parse_chain((char *)&in_table,local_440);
            if (piVar4 == (ip_chain_t *)0x0) {
              _log(__x_01);
            }
          }
          else if ((bVar1) &&
                  (piVar5 = parse_rule((char *)&in_table,local_440), piVar5 == (ip_rule_t *)0x0)) {
            _log(__x_02);
          }
        }
        else {
          local_440 = parse_table((char *)&in_table,(ip_tables_t *)path_local);
          if (local_440 == (ip_table_t *)0x0) {
            _log(__x_00);
          }
          else {
            bVar1 = true;
          }
        }
      }
    }
  }
  return (ip_tables_t *)path_local;
}

Assistant:

ip_tables_t *parse_tables(const char *path)
{
	FILE *fp = fopen(path, "r");
	char line[1024] = {0};
	int line_num = 0, in_table = 0;

	ip_tables_t *ipts = NULL;
	ip_table_t *ipt = NULL;

	if (fp == NULL) {
		log_err("open file \"%s\" failed: %m\n", path);
		return NULL;
	}

	ipts = _new(ip_tables_t);

	while (fgets(line, sizeof(line), fp) != NULL) {
		line_num++;

		if (line[0] == '#' || line[0] == '\n') {
			continue;

		} else if (strcmp(line, "COMMIT\n") == 0 && in_table) {
			in_table = 0;

		} else if (line[0] == '*' && !in_table) {
			if ((ipt = parse_table(line, ipts)) == NULL) {
				log_err("line: %d parse table failed\n", line_num);
			} else {
				in_table = 1;
			}

		} else if (line[0] == ':' && in_table) {
			if (parse_chain(line, ipt) == NULL) {
				log_err("line: %d parse chain failed\n", line_num);
			}

		} else if (in_table) {
			if (parse_rule(line, ipt) == NULL) {
				log_err("line: %d parse rule failed\n", line_num);
			}
		}
	}

	return ipts;
}